

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libspirv.cpp
# Opt level: O2

bool __thiscall
spvtools::SpirvTools::Parse
          (SpirvTools *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *binary,
          HeaderParser *header_parser,InstructionParser *instruction_parser,
          spv_diagnostic *diagnostic)

{
  uint32_t *code;
  spv_result_t sVar1;
  CxxParserContext parser_context;
  HeaderParser *local_10;
  InstructionParser *local_8;
  
  code = (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start;
  local_10 = header_parser;
  local_8 = instruction_parser;
  sVar1 = spvBinaryParse(((this->impl_)._M_t.
                          super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                          .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl)
                         ->context,&local_10,code,
                         (long)(binary->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)code >> 2,
                         Parse::anon_class_1_0_00000001::__invoke,
                         Parse::anon_class_1_0_00000001::__invoke,diagnostic);
  return sVar1 == SPV_SUCCESS;
}

Assistant:

bool SpirvTools::Parse(const std::vector<uint32_t>& binary,
                       const HeaderParser& header_parser,
                       const InstructionParser& instruction_parser,
                       spv_diagnostic* diagnostic) {
  CxxParserContext parser_context = {header_parser, instruction_parser};

  spv_parsed_header_fn_t header_fn_wrapper =
      [](void* user_data, spv_endianness_t endianness, uint32_t magic,
         uint32_t version, uint32_t generator, uint32_t id_bound,
         uint32_t reserved) {
        CxxParserContext* ctx = reinterpret_cast<CxxParserContext*>(user_data);
        spv_parsed_header_t header = {magic, version, generator, id_bound,
                                      reserved};

        return ctx->header_parser(endianness, header);
      };

  spv_parsed_instruction_fn_t instruction_fn_wrapper =
      [](void* user_data, const spv_parsed_instruction_t* instruction) {
        CxxParserContext* ctx = reinterpret_cast<CxxParserContext*>(user_data);
        return ctx->instruction_parser(*instruction);
      };

  spv_result_t status = spvBinaryParse(
      impl_->context, &parser_context, binary.data(), binary.size(),
      header_fn_wrapper, instruction_fn_wrapper, diagnostic);
  return status == SPV_SUCCESS;
}